

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O1

int fetch_all_pathways_db(feed_db_t *db,pathway_t **records)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  pathway_t *ppVar4;
  uchar *puVar5;
  long lVar6;
  double dVar7;
  sqlite3_stmt *stmt;
  pathway_t record;
  char qr [189];
  sqlite3_stmt *local_2e8;
  pathway_t local_2e0;
  char local_f8 [200];
  
  uVar2 = count_rows_db(db,"pathways");
  if (0 < (int)uVar2) {
    memcpy(local_f8,
           "SELECT pathway_id, from_stop_id, to_stop_id,pathway_mode, is_bidirectional, length, traversal_time, stair_count, max_slope, min_width,signposted_as, reversed_signposted_as FROM `pathways`;"
           ,0xbd);
    sqlite3_prepare_v2(db->conn,local_f8,-1,&local_2e8,(char **)0x0);
    ppVar4 = (pathway_t *)malloc((ulong)uVar2 * 0x1e8);
    *records = ppVar4;
    uVar1 = 0xffffffff;
    if (ppVar4 != (pathway_t *)0x0) {
      lVar6 = 0;
      do {
        iVar3 = sqlite3_step(local_2e8);
        db->rc = iVar3;
        uVar1 = uVar2;
        if (iVar3 != 100) break;
        init_pathway(&local_2e0);
        puVar5 = sqlite3_column_text(local_2e8,0);
        strcpy(local_2e0.id,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_2e8,1);
        strcpy(local_2e0.from_stop_id,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_2e8,2);
        strcpy(local_2e0.to_stop_id,(char *)puVar5);
        local_2e0.mode = sqlite3_column_int(local_2e8,3);
        local_2e0.is_bidirectional = sqlite3_column_int(local_2e8,4);
        local_2e0.length = sqlite3_column_double(local_2e8,5);
        dVar7 = sqlite3_column_double(local_2e8,6);
        local_2e0.traversal_time = (int)dVar7;
        dVar7 = sqlite3_column_double(local_2e8,7);
        local_2e0.stair_count = (int)dVar7;
        local_2e0.max_slope = sqlite3_column_double(local_2e8,8);
        local_2e0.min_width = sqlite3_column_double(local_2e8,9);
        puVar5 = sqlite3_column_text(local_2e8,10);
        strcpy(local_2e0.signposted_as,(char *)puVar5);
        puVar5 = sqlite3_column_text(local_2e8,0xb);
        strcpy(local_2e0.reversed_signposted_as,(char *)puVar5);
        memcpy((*records)->id + lVar6,&local_2e0,0x1e8);
        lVar6 = lVar6 + 0x1e8;
      } while ((ulong)uVar2 * 0x1e8 - lVar6 != 0);
    }
    uVar2 = uVar1;
    sqlite3_finalize(local_2e8);
  }
  return uVar2;
}

Assistant:

int fetch_all_pathways_db(feed_db_t *db, pathway_t **records) {

    pathway_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "pathways");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "pathway_id, from_stop_id, to_stop_id,"
                    "pathway_mode, is_bidirectional, length, traversal_time, stair_count, max_slope, min_width,"
                    "signposted_as, reversed_signposted_as "
                "FROM `pathways`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_pathway(&record);

        strcpy(record.id, sqlite3_column_text(stmt, 0));
        strcpy(record.from_stop_id, sqlite3_column_text(stmt, 1));
        strcpy(record.to_stop_id, sqlite3_column_text(stmt, 2));
        record.mode = (pathway_mode_t)sqlite3_column_int(stmt, 3);
        record.is_bidirectional = (pathway_directions_t)sqlite3_column_int(stmt, 4);
        record.length = sqlite3_column_double(stmt, 5);
        record.traversal_time = sqlite3_column_double(stmt, 6);
        record.stair_count = sqlite3_column_double(stmt, 7);
        record.max_slope = sqlite3_column_double(stmt, 8);
        record.min_width = sqlite3_column_double(stmt, 9);
        strcpy(record.signposted_as, sqlite3_column_text(stmt, 10));
        strcpy(record.reversed_signposted_as, sqlite3_column_text(stmt, 11));

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}